

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll.c
# Opt level: O3

int poll_del(event_base *base,int fd,short old,short events,void *idx_)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  long lVar5;
  ulong uVar6;
  int *piVar7;
  ushort uVar8;
  
  if ((events & 8U) == 0) {
    if ((events & 6U) == 0) {
      return 0;
    }
    iVar2 = *idx_;
    if (iVar2 < 1) {
      return -1;
    }
    pvVar4 = base->evbase;
    uVar6 = (ulong)(iVar2 - 1);
    lVar5 = *(long *)((long)pvVar4 + 0x10);
    if ((events & 2U) != 0) {
      pbVar1 = (byte *)(lVar5 + 4 + uVar6 * 8);
      *pbVar1 = *pbVar1 & 0xfe;
    }
    uVar8 = *(ushort *)(lVar5 + 4 + uVar6 * 8);
    if ((events & 4U) != 0) {
      uVar8 = uVar8 & 0xfffb;
      *(ushort *)(lVar5 + 4 + uVar6 * 8) = uVar8;
    }
    if (uVar8 != 0) {
      return 0;
    }
    *(undefined4 *)idx_ = 0;
    iVar3 = *(int *)((long)pvVar4 + 4);
    *(int *)((long)pvVar4 + 4) = iVar3 + -1;
    if (iVar2 == iVar3) {
      return 0;
    }
    *(undefined8 *)(*(long *)((long)pvVar4 + 0x10) + uVar6 * 8) =
         *(undefined8 *)(*(long *)((long)pvVar4 + 0x10) + -8 + (long)iVar3 * 8);
    piVar7 = (int *)evmap_io_get_fdinfo_
                              (&base->io,*(int *)(*(long *)((long)pvVar4 + 0x10) + uVar6 * 8));
    if (piVar7 != (int *)0x0) {
      if (*piVar7 == *(int *)((long)pvVar4 + 4) + 1) {
        *piVar7 = iVar2;
        return 0;
      }
      goto LAB_001f1826;
    }
  }
  else {
    poll_del_cold_1();
  }
  poll_del_cold_3();
LAB_001f1826:
  poll_del_cold_2();
}

Assistant:

static int
poll_del(struct event_base *base, int fd, short old, short events, void *idx_)
{
	struct pollop *pop = base->evbase;
	struct pollfd *pfd = NULL;
	struct pollidx *idx = idx_;
	int i;

	EVUTIL_ASSERT((events & EV_SIGNAL) == 0);
	if (!(events & (EV_READ|EV_WRITE)))
		return (0);

	poll_check_ok(pop);
	i = idx->idxplus1 - 1;
	if (i < 0)
		return (-1);

	/* Do we still want to read or write? */
	pfd = &pop->event_set[i];
	if (events & EV_READ)
		pfd->events &= ~POLLIN;
	if (events & EV_WRITE)
		pfd->events &= ~POLLOUT;
	poll_check_ok(pop);
	if (pfd->events)
		/* Another event cares about that fd. */
		return (0);

	/* Okay, so we aren't interested in that fd anymore. */
	idx->idxplus1 = 0;

	--pop->nfds;
	if (i != pop->nfds) {
		/*
		 * Shift the last pollfd down into the now-unoccupied
		 * position.
		 */
		memcpy(&pop->event_set[i], &pop->event_set[pop->nfds],
		       sizeof(struct pollfd));
		idx = evmap_io_get_fdinfo_(&base->io, pop->event_set[i].fd);
		EVUTIL_ASSERT(idx);
		EVUTIL_ASSERT(idx->idxplus1 == pop->nfds + 1);
		idx->idxplus1 = i + 1;
	}

	poll_check_ok(pop);
	return (0);
}